

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O0

void handle_internal_cmd(nh_cmd_desc **cmd,nh_cmd_arg *arg,int *count)

{
  nh_direction nVar1;
  nh_cmd_desc *pnVar2;
  wchar_t id;
  int *count_local;
  nh_cmd_arg *arg_local;
  nh_cmd_desc **cmd_local;
  
  nVar1 = (*cmd)->flags & 0x1fffffff;
  switch(nVar1) {
  case DIR_W:
  case DIR_NW:
  case DIR_N:
  case DIR_NE:
  case DIR_E:
  case DIR_SE:
  case DIR_S:
  case DIR_SW:
  case DIR_UP:
  case DIR_DOWN:
    arg->argtype = 4;
    (arg->field_1).d = nVar1;
    if (((*cmd)->flags & 0x20000000) == 0) {
      if (((*cmd)->flags & 0x40000000) == 0) {
        if (((*cmd)->flags & 0x80000000) != 0) {
          pnVar2 = find_command("go2");
          *cmd = pnVar2;
        }
      }
      else {
        pnVar2 = find_command("run");
        *cmd = pnVar2;
      }
    }
    else {
      pnVar2 = find_command("move");
      *cmd = pnVar2;
    }
    break;
  case DIR_SELF|DIR_NW:
    display_options('\0');
    *cmd = (nh_cmd_desc *)0x0;
    break;
  case DIR_UP|DIR_E:
    pnVar2 = doextcmd();
    *cmd = pnVar2;
    break;
  case DIR_UP|DIR_SE:
    arg->argtype = 2;
    pnVar2 = show_help();
    *cmd = pnVar2;
    break;
  case DIR_UP|DIR_S:
    *cmd = prev_cmd;
    *arg = prev_arg;
    *count = prev_count;
    break;
  case DIR_UP|DIR_SW:
    *cmd = (nh_cmd_desc *)0x0;
    break;
  case 0x10:
    doprev_message();
    *cmd = (nh_cmd_desc *)0x0;
    break;
  case 0x11:
    show_whatdoes();
    *cmd = (nh_cmd_desc *)0x0;
    break;
  case 0x12:
    *cmd = (nh_cmd_desc *)0x0;
  }
  return;
}

Assistant:

void handle_internal_cmd(struct nh_cmd_desc **cmd, struct nh_cmd_arg *arg, int *count)
{
    int id = (*cmd)->flags & ~(CMD_UI | DIRCMD | DIRCMD_SHIFT | DIRCMD_CTRL);
    switch (id) {
	case DIR_NW: case DIR_N: case DIR_NE:
	case DIR_E:              case DIR_W:
	case DIR_SW: case DIR_S: case DIR_SE:
	case DIR_UP: case DIR_DOWN:
	    arg->argtype = CMD_ARG_DIR;
	    arg->d = id;
	    if ((*cmd)->flags & DIRCMD)
		*cmd = find_command("move");
	    else if((*cmd)->flags & DIRCMD_SHIFT)
		*cmd = find_command("run");
	    else if((*cmd)->flags & DIRCMD_CTRL)
		*cmd = find_command("go2");
	    break;

	case UICMD_OPTIONS:
	    display_options(FALSE);
	    *cmd = NULL;
	    break;

	case UICMD_EXTCMD:
	    *cmd = doextcmd();
	    break;

	case UICMD_HELP:
	    arg->argtype = CMD_ARG_NONE;
	    *cmd = show_help();
	    break;

	case UICMD_REDO:
	    *cmd = prev_cmd;
	    *arg = prev_arg;
	    *count = prev_count;
	    break;

	case UICMD_REPEATPREFIX:
	    *cmd = NULL;
	    break;

	case UICMD_PREVMSG:
	    doprev_message();
	    *cmd = NULL;
	    break;

	case UICMD_WHATDOES:
	    show_whatdoes();
	    *cmd = NULL;
	    break;

	case UICMD_NOTHING:
	    *cmd = NULL;
	    break;
    }
}